

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

VNode * despot::DPOMCP::ConstructTree
                  (vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
                  RandomStreams *streams,DSPOMDP *model,POMCPPrior *prior,History *history,
                  double timeout)

{
  pointer ppSVar1;
  pointer ppSVar2;
  int iVar3;
  int iVar4;
  VNode *vnode;
  log_ostream *plVar5;
  ostream *poVar6;
  clock_t cVar7;
  undefined4 extraout_var;
  clock_t cVar8;
  int i;
  ulong uVar9;
  ValuedAction VVar10;
  ValuedAction local_70;
  History local_60;
  
  History::History(&local_60,history);
  (*prior->_vptr_POMCPPrior[5])(prior,&local_60);
  History::~History(&local_60);
  vnode = POMCP::CreateVNode(0,*(particles->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_start,prior,model);
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (uVar9 = 0; uVar9 < (ulong)((long)ppSVar2 - (long)ppSVar1 >> 3); uVar9 = uVar9 + 1) {
    ppSVar1[uVar9]->scenario_id = (int)uVar9;
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      poVar6 = std::operator<<(&plVar5->super_ostream,
                               "[DPOMCP::ConstructTree] # active particles before search = ");
      iVar3 = (*model->_vptr_DSPOMDP[0x18])(model);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  cVar7 = clock();
  iVar3 = 0;
  do {
    iVar4 = logging::level();
    if (0 < iVar4) {
      iVar4 = logging::level();
      if (3 < iVar4) {
        plVar5 = logging::stream(4);
        poVar6 = std::operator<<(&plVar5->super_ostream,"Simulation ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    iVar4 = Random::NextInt((Random *)&Random::RANDOM,
                            (int)((ulong)((long)(particles->
                                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(particles->
                                               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                               )._M_impl.super__Vector_impl_data._M_start) >> 3));
    iVar4 = (*model->_vptr_DSPOMDP[0x16])
                      (model,(particles->
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[iVar4]);
    POMCP::Simulate((State *)CONCAT44(extraout_var,iVar4),streams,vnode,model,prior);
    iVar3 = iVar3 + 1;
    (*model->_vptr_DSPOMDP[0x17])(model,(State *)CONCAT44(extraout_var,iVar4));
    cVar8 = clock();
  } while (((double)cVar8 - (double)cVar7) / 1000000.0 < timeout);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      poVar6 = std::operator<<(&plVar5->super_ostream,"[DPOMCP::ConstructTree] OptimalAction = ");
      VVar10 = POMCP::OptimalAction(vnode);
      local_70.value = VVar10.value;
      local_70.action = VVar10.action;
      poVar6 = despot::operator<<(poVar6,&local_70);
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(poVar6,"# Simulations = ");
      iVar3 = VNode::count(vnode);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<(poVar6,"# active particles after search = ");
      iVar3 = (*model->_vptr_DSPOMDP[0x18])(model);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  return vnode;
}

Assistant:

VNode* DPOMCP::ConstructTree(vector<State*>& particles, RandomStreams& streams,
	const DSPOMDP* model, POMCPPrior* prior, History& history, double timeout) {
	prior->history(history);
	VNode* root = CreateVNode(0, particles[0], prior, model);

	for (int i = 0; i < particles.size(); i++)
		particles[i]->scenario_id = i;

	logi << "[DPOMCP::ConstructTree] # active particles before search = "
		<< model->NumActiveParticles() << endl;
	double start = clock();
	int num_sims = 0;
	while (true) {
		logd << "Simulation " << num_sims << endl;

		int index = Random::RANDOM.NextInt(particles.size());
		State* particle = model->Copy(particles[index]);
		Simulate(particle, streams, root, model, prior);
		num_sims++;
		model->Free(particle);

		if ((clock() - start) / CLOCKS_PER_SEC >= timeout) {
			break;
		}
	}

	logi << "[DPOMCP::ConstructTree] OptimalAction = " << OptimalAction(root)
		<< endl << "# Simulations = " << root->count() << endl
		<< "# active particles after search = " << model->NumActiveParticles()
		<< endl;

	return root;
}